

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar6;
  long lVar7;
  char *pcVar8;
  char *__last;
  int iVar9;
  ulong uVar10;
  char_type buffer [13];
  char acStack_26 [14];
  
  bVar6 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  uVar4 = (ulong)*(uint *)this;
  lVar7 = (long)*(int *)(this + 4);
  __last = acStack_26 + lVar7 + 1;
  pcVar8 = __last;
  if (uVar4 < 100) {
    if (*(uint *)this < 10) goto LAB_001d4e2c;
    uVar5 = uVar4 * 2;
    pcVar8 = acStack_26 + lVar7;
    acStack_26[lVar7] = internal::basic_data<void>::DIGITS[uVar4 * 2 + 1];
  }
  else {
    iVar9 = 0;
    do {
      uVar5 = uVar4;
      uVar2 = (uint)uVar5;
      uVar4 = uVar5 / 100;
      iVar3 = (int)(uVar5 / 100);
      uVar10 = (ulong)((uVar2 + iVar3 * -100) * 2);
      pcVar8[-1] = internal::basic_data<void>::DIGITS[uVar10 + 1];
      if (iVar9 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pcVar8 + -2) = this[8];
        pcVar8[-3] = internal::basic_data<void>::DIGITS[uVar10];
        if ((uint)((iVar9 + 2) * -0x55555555) < 0x55555556) {
          lVar7 = -4;
          goto LAB_001d4ddc;
        }
        pcVar8 = pcVar8 + -3;
      }
      else {
        pcVar8[-2] = internal::basic_data<void>::DIGITS[uVar10];
        if ((uint)((iVar9 + 2) * -0x55555555) < 0x55555556) {
          lVar7 = -3;
LAB_001d4ddc:
          *(num_writer *)(pcVar8 + lVar7) = this[8];
          pcVar8 = pcVar8 + lVar7;
        }
        else {
          pcVar8 = pcVar8 + -2;
        }
      }
      iVar9 = iVar9 + 2;
    } while (9999 < uVar2);
    if (uVar2 < 1000) {
LAB_001d4e2c:
      bVar1 = (byte)uVar4 | 0x30;
      goto LAB_001d4e61;
    }
    uVar5 = (ulong)(uint)(iVar3 + (int)(uVar5 / 100));
    pcVar8[-1] = internal::basic_data<void>::DIGITS[uVar5 + 1];
    if (iVar9 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
      *(num_writer *)(pcVar8 + -2) = this[8];
      pcVar8 = pcVar8 + -2;
    }
    else {
      pcVar8 = pcVar8 + -1;
    }
  }
  bVar1 = internal::basic_data<void>::DIGITS[uVar5 & 0xffffffff];
LAB_001d4e61:
  pcVar8[-1] = bVar1;
  bVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_26 + 1,__last,bVar6);
  it->container = (list<char,_std::allocator<char>_> *)bVar6;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }